

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O1

int compute_bitmap_width_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Drawonable *pAVar2;
  int iVar3;
  Am_Image_Array image;
  int ret_width;
  int ret_height;
  Am_Image_Array AStack_28;
  Am_Object local_20;
  int local_18;
  undefined1 local_14 [4];
  
  Am_Image_Array::Am_Image_Array(&AStack_28);
  in_value = Am_Object::Get(self,0xb0,0);
  Am_Image_Array::operator=(&AStack_28,in_value);
  bVar1 = Am_Image_Array::Valid(&AStack_28);
  iVar3 = 0;
  if (bVar1) {
    Am_Object::Am_Object(&local_20,self);
    pAVar2 = GV_a_drawonable(&local_20);
    Am_Object::~Am_Object(&local_20);
    (*pAVar2->_vptr_Am_Drawonable[0x16])(pAVar2,&AStack_28,&local_18,local_14);
    iVar3 = local_18;
  }
  Am_Image_Array::~Am_Image_Array(&AStack_28);
  return iVar3;
}

Assistant:

Am_Define_Formula(int, compute_bitmap_width)
{
  Am_Image_Array image;
  image = self.Get(Am_IMAGE);
  if (image.Valid()) {
    int ret_width, ret_height;
    Am_Drawonable *drawonable = GV_a_drawonable(self);
    drawonable->Get_Image_Size(image, ret_width, ret_height);
    return ret_width;
  }
  // no image, so return 0
  return 0;
}